

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

bool __thiscall Hpipe::Lexer::assemble_barg(Lexer *this,Lexem *o,int need_left,int need_right)

{
  Lexem *pLVar1;
  char *msg;
  char *str;
  Source *source;
  ErrorList *this_00;
  
  if ((need_right == 0) || (o->next != (Lexem *)0x0)) {
    pLVar1 = o->prev;
    if (pLVar1 != (Lexem *)0x0 || need_left == 0) {
      if (pLVar1->parent != (Lexem *)0x0) {
        o->parent = pLVar1->parent;
        pLVar1->parent->children[pLVar1->parent->children[0] != pLVar1] = o;
      }
      pLVar1 = o->prev;
      if (pLVar1->prev != (Lexem *)0x0) {
        pLVar1->prev->next = o;
      }
      o->children[0] = pLVar1;
      pLVar1->parent = o;
      o->prev = pLVar1->prev;
      o->children[0]->next = (Lexem *)0x0;
      o->children[0]->prev = (Lexem *)0x0;
      pLVar1 = o->next;
      if (pLVar1->next != (Lexem *)0x0) {
        pLVar1->next->prev = o;
      }
      o->children[1] = pLVar1;
      pLVar1->parent = o;
      o->next = pLVar1->next;
      o->children[1]->prev = (Lexem *)0x0;
      o->children[1]->next = (Lexem *)0x0;
      return true;
    }
    this_00 = this->error_list;
    str = o->beg;
    source = o->source;
    msg = "Operator needs a left expression.";
  }
  else {
    this_00 = this->error_list;
    str = o->beg;
    source = o->source;
    msg = "Operator needs a right expression.";
  }
  ErrorList::add(this_00,source,str,msg);
  return false;
}

Assistant:

bool Lexer::assemble_barg( Lexem *o, int need_left, int need_right ) {
    if ( need_right and not o->next )
        return err( o, "Operator needs a right expression." );
    if ( need_left and not o->prev )
        return err( o, "Operator needs a left expression." );
    // prev
    if ( o->prev->parent ) {
        o->parent = o->prev->parent;
        if (o->prev->parent->children[ 0 ] == o->prev)
            o->prev->parent->children[ 0 ] = o;
        else
            o->prev->parent->children[ 1 ] = o;
    }
    if ( o->prev->prev )
        o->prev->prev->next = o;

    o->children[ 0 ] = o->prev;
    o->children[ 0 ]->parent = o;
    o->prev = o->prev->prev;

    o->children[ 0 ]->next = NULL;
    o->children[ 0 ]->prev = NULL;

    // next
    if ( o->next->next )
        o->next->next->prev = o;

    o->children[ 1 ] = o->next;
    o->children[ 1 ]->parent = o;
    o->next = o->next->next;

    o->children[ 1 ]->prev = NULL;
    o->children[ 1 ]->next = NULL;

    return true;
}